

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlCharacters(xmlParserCtxtPtr ctxt,xmlChar *buf,int size,int isBlank)

{
  xmlChar xVar1;
  _xmlSAXHandler *p_Var2;
  xmlDocPtr pxVar3;
  charactersSAXFunc p_Var4;
  xmlNode *node;
  ignorableWhitespaceSAXFunc UNRECOVERED_JUMPTABLE;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  void *pvVar8;
  xmlNodePtr pxVar9;
  ulong uVar10;
  xmlChar *pxVar11;
  
  p_Var2 = ctxt->sax;
  if (p_Var2 == (_xmlSAXHandler *)0x0) {
    return;
  }
  if (ctxt->disableSAX != 0) {
    return;
  }
  if ((ctxt->keepBlanks == 0) || (p_Var2->ignorableWhitespace != p_Var2->characters)) {
    bVar5 = true;
    if ((ctxt->space == (int *)0x0) || ((iVar6 = *ctxt->space, iVar6 == -2 || (iVar6 == 1))))
    goto LAB_0013cb86;
    if (isBlank == 0) {
      uVar7 = 0;
      uVar10 = 0;
      if (0 < size) {
        uVar10 = (ulong)(uint)size;
      }
      for (; uVar10 != uVar7; uVar7 = uVar7 + 1) {
        if ((0x20 < (ulong)buf[uVar7]) || ((0x100002600U >> ((ulong)buf[uVar7] & 0x3f) & 1) == 0))
        goto LAB_0013cb86;
      }
    }
    pxVar9 = ctxt->node;
    if (pxVar9 == (xmlNodePtr)0x0) goto LAB_0013cb86;
    pxVar3 = ctxt->myDoc;
    if (pxVar3 != (xmlDocPtr)0x0) {
      if (pxVar9->ns == (xmlNs *)0x0) {
        pxVar11 = (xmlChar *)0x0;
      }
      else {
        pxVar11 = pxVar9->ns->prefix;
      }
      if (((pxVar3->intSubset != (_xmlDtd *)0x0) &&
          (pvVar8 = xmlHashLookup2((xmlHashTablePtr)pxVar3->intSubset->elements,pxVar9->name,pxVar11
                                  ), pvVar8 != (void *)0x0)) ||
         ((pxVar3->extSubset != (_xmlDtd *)0x0 &&
          (pvVar8 = xmlHashLookup2((xmlHashTablePtr)pxVar3->extSubset->elements,ctxt->node->name,
                                   pxVar11), pvVar8 != (void *)0x0)))) {
        if (*(int *)((long)pvVar8 + 0x48) - 2U < 2) goto LAB_0013cb86;
        if (*(int *)((long)pvVar8 + 0x48) == 4) goto LAB_0013ccd0;
      }
    }
    pxVar11 = ctxt->input->cur;
    xVar1 = *pxVar11;
    if (((xVar1 == '<') || (xVar1 == '\r')) &&
       ((xVar1 != '<' || ((ctxt->node->children != (_xmlNode *)0x0 || (pxVar11[1] != '/')))))) {
      pxVar9 = xmlGetLastChild(ctxt->node);
      if (pxVar9 == (xmlNodePtr)0x0) {
        if ((ctxt->node->type == XML_ELEMENT_NODE) || (ctxt->node->content == (xmlChar *)0x0))
        goto LAB_0013ccd0;
      }
      else {
        iVar6 = xmlNodeIsText(pxVar9);
        if ((iVar6 == 0) &&
           ((node = ctxt->node->children, node == (xmlNode *)0x0 ||
            (iVar6 = xmlNodeIsText(node), iVar6 == 0)))) {
LAB_0013ccd0:
          UNRECOVERED_JUMPTABLE = ctxt->sax->ignorableWhitespace;
          if (UNRECOVERED_JUMPTABLE == (ignorableWhitespaceSAXFunc)0x0) {
            return;
          }
          if (ctxt->keepBlanks == 0) {
            return;
          }
          (*UNRECOVERED_JUMPTABLE)(ctxt->userData,buf,size);
          return;
        }
      }
    }
  }
  else {
    bVar5 = false;
  }
LAB_0013cb86:
  p_Var4 = ctxt->sax->characters;
  if (p_Var4 != (charactersSAXFunc)0x0) {
    (*p_Var4)(ctxt->userData,buf,size);
  }
  if ((bVar5) && (*ctxt->space == -1)) {
    *ctxt->space = -2;
  }
  return;
}

Assistant:

static void
xmlCharacters(xmlParserCtxtPtr ctxt, const xmlChar *buf, int size,
              int isBlank) {
    int checkBlanks;

    if ((ctxt->sax == NULL) || (ctxt->disableSAX))
        return;

    checkBlanks = (!ctxt->keepBlanks) ||
                  (ctxt->sax->ignorableWhitespace != ctxt->sax->characters);

    /*
     * Calling areBlanks with only parts of a text node
     * is fundamentally broken, making the NOBLANKS option
     * essentially unusable.
     */
    if ((checkBlanks) &&
        (areBlanks(ctxt, buf, size, isBlank))) {
        if ((ctxt->sax->ignorableWhitespace != NULL) &&
            (ctxt->keepBlanks))
            ctxt->sax->ignorableWhitespace(ctxt->userData, buf, size);
    } else {
        if (ctxt->sax->characters != NULL)
            ctxt->sax->characters(ctxt->userData, buf, size);

        /*
         * The old code used to update this value for "complex" data
         * even if checkBlanks was false. This was probably a bug.
         */
        if ((checkBlanks) && (*ctxt->space == -1))
            *ctxt->space = -2;
    }
}